

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ThreadSafeArena::InitializeWithPolicy
          (ThreadSafeArena *this,void *mem,size_t size,AllocationPolicy policy)

{
  ulong uVar1;
  bool bVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  Memory MVar5;
  LogFinisher local_71;
  void *p;
  LogMessage local_68;
  
  MVar5.size = size;
  MVar5.ptr = mem;
  uVar1 = *(ulong *)(this + 8);
  bVar2 = AllocationPolicy::IsDefault(&policy);
  if (bVar2) {
    InitializeFrom(this,mem,size);
    if (uVar1 < 4) {
      return;
    }
    if ((((uint)uVar1 ^ *(uint *)(this + 8)) & 3) == 0) {
      return;
    }
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
               ,0xf6);
    pLVar3 = LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (old_alloc_policy & 3) == (alloc_policy_.get_raw() & 3): ");
    LogFinisher::operator=((LogFinisher *)&p,pLVar3);
  }
  else {
    if (((ulong)mem & 7) != 0) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                 ,0xf9);
      pLVar3 = LogMessage::operator<<
                         (&local_68,"CHECK failed: (reinterpret_cast<uintptr_t>(mem) & 7) == (0u): "
                         );
      LogFinisher::operator=((LogFinisher *)&p,pLVar3);
      LogMessage::~LogMessage(&local_68);
    }
    Init(this);
    if (policy.metrics_collector == (ArenaMetricsCollector *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)((uint)(byte)policy.metrics_collector[8] * 2);
    }
    uVar4 = *(ulong *)(this + 8) & 0xfffffffffffffffd | uVar4;
    *(ulong *)(this + 8) = uVar4;
    if (size < 0x78 || mem == (void *)0x0) {
      MVar5 = AllocateMemory(&policy,0,0x78);
    }
    else {
      *(ulong *)(this + 8) = uVar4 | 1;
    }
    SetInitialBlock(this,MVar5.ptr,MVar5.size);
    if ((*(SerialArena **)(this + 0x10) == (SerialArena *)0x0) ||
       (bVar2 = SerialArena::MaybeAllocateAligned(*(SerialArena **)(this + 0x10),0x28,&p), !bVar2))
    {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                 ,0x115);
      pLVar3 = LogMessage::operator<<(&local_68,"MaybeAllocateAligned cannot fail here.");
      LogFinisher::operator=(&local_71,pLVar3);
    }
    else {
      *(ArenaMetricsCollector **)((long)p + 0x20) = policy.metrics_collector;
      *(_func_void_ptr_size_t **)((long)p + 0x10) = policy.block_alloc;
      *(_func_void_void_ptr_size_t **)((long)p + 0x18) = policy.block_dealloc;
      *(size_t *)p = policy.start_block_size;
      *(size_t *)((long)p + 8) = policy.max_block_size;
      if (((ulong)p & 3) != 0) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                   ,0x11a);
        pLVar3 = LogMessage::operator<<
                           (&local_68,"CHECK failed: (0) == (reinterpret_cast<uintptr_t>(p) & 3): ")
        ;
        LogFinisher::operator=(&local_71,pLVar3);
        LogMessage::~LogMessage(&local_68);
      }
      uVar4 = (ulong)((uint)*(undefined8 *)(this + 8) & 7) | (ulong)p;
      *(ulong *)(this + 8) = uVar4;
      if (uVar1 < 4) {
        return;
      }
      if ((((uint)uVar4 ^ (uint)uVar1) & 3) == 0) {
        return;
      }
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                 ,0x11c);
      pLVar3 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (old_alloc_policy & 3) == (alloc_policy_.get_raw() & 3): ")
      ;
      LogFinisher::operator=(&local_71,pLVar3);
    }
  }
  LogMessage::~LogMessage(&local_68);
  return;
}

Assistant:

void ThreadSafeArena::InitializeWithPolicy(void* mem, size_t size,
                                           AllocationPolicy policy) {
#ifndef NDEBUG
  const uint64_t old_alloc_policy = alloc_policy_.get_raw();
  // If there was a policy (e.g., in Reset()), make sure flags were preserved.
#define GOOGLE_DCHECK_POLICY_FLAGS_() \
  if (old_alloc_policy > 3)    \
    GOOGLE_CHECK_EQ(old_alloc_policy & 3, alloc_policy_.get_raw() & 3)
#else
#define GOOGLE_DCHECK_POLICY_FLAGS_()
#endif  // NDEBUG

  if (policy.IsDefault()) {
    // Legacy code doesn't use the API above, but provides the initial block
    // through ArenaOptions. I suspect most do not touch the allocation
    // policy parameters.
    InitializeFrom(mem, size);
    GOOGLE_DCHECK_POLICY_FLAGS_();
    return;
  }
  GOOGLE_DCHECK_EQ(reinterpret_cast<uintptr_t>(mem) & 7, 0u);
  Init();

  // Ignore initial block if it is too small. We include an optional
  // AllocationPolicy in this check, so that this can be allocated on the
  // first block.
  constexpr size_t kAPSize = internal::AlignUpTo8(sizeof(AllocationPolicy));
  constexpr size_t kMinimumSize = kBlockHeaderSize + kSerialArenaSize + kAPSize;

  // The value for alloc_policy_ stores whether or not allocations should be
  // recorded.
  alloc_policy_.set_should_record_allocs(
      policy.metrics_collector != nullptr &&
      policy.metrics_collector->RecordAllocs());
  // Make sure we have an initial block to store the AllocationPolicy.
  if (mem != nullptr && size >= kMinimumSize) {
    alloc_policy_.set_is_user_owned_initial_block(true);
  } else {
    auto tmp = AllocateMemory(&policy, 0, kMinimumSize);
    mem = tmp.ptr;
    size = tmp.size;
  }
  SetInitialBlock(mem, size);

  auto sa = threads_.load(std::memory_order_relaxed);
  // We ensured enough space so this cannot fail.
  void* p;
  if (!sa || !sa->MaybeAllocateAligned(kAPSize, &p)) {
    GOOGLE_LOG(FATAL) << "MaybeAllocateAligned cannot fail here.";
    return;
  }
  new (p) AllocationPolicy{policy};
  // Low bits store flags, so they mustn't be overwritten.
  GOOGLE_DCHECK_EQ(0, reinterpret_cast<uintptr_t>(p) & 3);
  alloc_policy_.set_policy(reinterpret_cast<AllocationPolicy*>(p));
  GOOGLE_DCHECK_POLICY_FLAGS_();

#undef GOOGLE_DCHECK_POLICY_FLAGS_
}